

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

uchar * header_bytes(archive_read *a,size_t rbytes)

{
  void *pvVar1;
  uchar *in_RAX;
  ssize_t sVar2;
  uchar *puVar3;
  undefined8 uVar4;
  void *buff;
  uchar *local_28;
  
  pvVar1 = a->format->data;
  if (*(ulong *)((long)pvVar1 + 0x70) < rbytes) {
LAB_0016f3f2:
    puVar3 = (uchar *)0x0;
  }
  else {
    local_28 = in_RAX;
    if (*(long *)((long)pvVar1 + 0x120) != 0) {
      read_consume(a);
    }
    if (*(int *)((long)pvVar1 + 0x6c) == 0) {
      puVar3 = (uchar *)__archive_read_ahead(a,rbytes,(ssize_t *)0x0);
      if (puVar3 == (uchar *)0x0) {
        return (uchar *)0x0;
      }
      *(long *)((long)pvVar1 + 0x70) = *(long *)((long)pvVar1 + 0x70) - rbytes;
      *(size_t *)((long)pvVar1 + 0x120) = rbytes;
    }
    else {
      sVar2 = read_stream(a,&local_28,rbytes,rbytes);
      if (sVar2 < 1) goto LAB_0016f3f2;
      *(long *)((long)pvVar1 + 0x70) = *(long *)((long)pvVar1 + 0x70) - sVar2;
      puVar3 = local_28;
    }
    uVar4 = crc32(*(undefined8 *)((long)pvVar1 + 0x78),puVar3,rbytes & 0xffffffff);
    *(undefined8 *)((long)pvVar1 + 0x78) = uVar4;
  }
  return puVar3;
}

Assistant:

static const unsigned char *
header_bytes(struct archive_read *a, size_t rbytes)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;

	if (zip->header_bytes_remaining < rbytes)
		return (NULL);
	if (zip->pack_stream_bytes_unconsumed)
		read_consume(a);

	if (zip->header_is_encoded == 0) {
		p = __archive_read_ahead(a, rbytes, NULL);
		if (p == NULL)
			return (NULL);
		zip->header_bytes_remaining -= rbytes;
		zip->pack_stream_bytes_unconsumed = rbytes;
	} else {
		const void *buff;
		ssize_t bytes;

		bytes = read_stream(a, &buff, rbytes, rbytes);
		if (bytes <= 0)
			return (NULL);
		zip->header_bytes_remaining -= bytes;
		p = buff;
	}

	/* Update checksum */
	zip->header_crc32 = crc32(zip->header_crc32, p, (unsigned)rbytes);
	return (p);
}